

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void __thiscall Fl_Widget_Type::copy_properties(Fl_Widget_Type *this)

{
  Fl_Widget *this_00;
  Fl_Widget *pFVar1;
  Fl_Button *this_01;
  Fl_Valuator *this_02;
  Fl_Spinner *this_03;
  Fl_Fontsize FVar2;
  Fl_Color FVar3;
  Fl_Align FVar4;
  void *pvVar5;
  Fl_Image *pFVar6;
  uchar uVar7;
  int iVar8;
  uint uVar9;
  
  this_00 = this->live_widget;
  if (this_00 != (Fl_Widget *)0x0) {
    Fl_Widget::label(this_00,(this->o->label_).value);
    Fl_Widget::tooltip(this_00,this->tooltip_);
    pFVar1 = this->o;
    this_00->type_ = pFVar1->type_;
    this_00->box_ = pFVar1->box_;
    FVar3 = pFVar1->color2_;
    this_00->color_ = pFVar1->color_;
    this_00->color2_ = FVar3;
    (this_00->label_).type = (pFVar1->label_).type;
    FVar2 = (pFVar1->label_).size;
    FVar3 = (pFVar1->label_).color;
    FVar4 = (pFVar1->label_).align_;
    (this_00->label_).font = (pFVar1->label_).font;
    (this_00->label_).size = FVar2;
    (this_00->label_).color = FVar3;
    (this_00->label_).align_ = FVar4;
    iVar8 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
    if (iVar8 != 0) {
      this_01 = (Fl_Button *)this->live_widget;
      pFVar1 = this->o;
      this_01->down_box_ = *(uchar *)((long)&pFVar1[1]._vptr_Fl_Widget + 6);
      this_01->shortcut_ = *(int *)&pFVar1[1]._vptr_Fl_Widget;
      Fl_Button::value(this_01,(int)*(char *)((long)&pFVar1[1]._vptr_Fl_Widget + 4));
    }
    iVar8 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x19])(this);
    if (iVar8 != 0) {
      *(undefined4 *)((long)&this->live_widget[1].label_.value + 4) =
           *(undefined4 *)((long)&this->o[1].label_.value + 4);
    }
    iVar8 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1a])(this);
    if (iVar8 != 0) {
      this->live_widget[2].color_ = this->o[2].color_;
    }
    iVar8 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1b])(this);
    if (iVar8 != 0) {
      this->live_widget[3].w_ = this->o[3].w_;
    }
    iVar8 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
    if (iVar8 != 0) {
      this_02 = (Fl_Valuator *)this->live_widget;
      pFVar1 = this->o;
      pvVar5 = pFVar1[1].user_data_;
      this_02->min = (double)pFVar1[1].callback_;
      this_02->max = (double)pvVar5;
      Fl_Valuator::step(this_02,*(double *)&pFVar1[1].x_ / (double)pFVar1[1].w_);
      Fl_Valuator::value(this_02,(double)pFVar1[1]._vptr_Fl_Widget);
      iVar8 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
      if (1 < iVar8) {
        Fl_Slider::slider_size((Fl_Slider *)this->live_widget,(double)(float)this->o[1].h_);
      }
    }
    iVar8 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])(this);
    if (iVar8 != 0) {
      this_03 = (Fl_Spinner *)this->live_widget;
      pFVar1 = this->o;
      pFVar6 = pFVar1[1].label_.image;
      this_03->minimum_ = (double)pFVar1[1].label_.value;
      this_03->maximum_ = (double)pFVar6;
      Fl_Spinner::step(this_03,(double)pFVar1[1].label_.deimage);
      this_03->value_ = *(double *)&pFVar1[1].w_;
      Fl_Spinner::update(this_03);
    }
    uVar9 = this->o->flags_;
    if ((uVar9 & 2) != 0) {
      (*this_00->_vptr_Fl_Widget[6])(this_00);
      uVar9 = this->o->flags_;
    }
    if ((uVar9 & 1) != 0) {
      Fl_Widget::deactivate(this_00);
    }
    uVar7 = resizable(this);
    if ((uVar7 != '\0') && (this_00->parent_ != (Fl_Group *)0x0)) {
      this_00->parent_->resizable_ = this->o;
    }
  }
  return;
}

Assistant:

void Fl_Widget_Type::copy_properties() {
  if (!live_widget) 
    return;

  // copy all attributes common to all widget types
  Fl_Widget *w = live_widget;
  w->label(o->label());
  w->tooltip(tooltip());
  w->type(o->type());
  w->box(o->box());
  w->color(o->color());
  w->selection_color(o->selection_color());
  w->labeltype(o->labeltype());
  w->labelfont(o->labelfont());
  w->labelsize(o->labelsize());
  w->labelcolor(o->labelcolor());
  w->align(o->align());

  // copy all attributes specific to widgets derived from Fl_Button
  if (is_button()) {
    Fl_Button* d = (Fl_Button*)live_widget, *s = (Fl_Button*)o;
    d->down_box(s->down_box());
    d->shortcut(s->shortcut());
    d->value(s->value());
  }

  // copy all attributes specific to widgets derived from Fl_Input_
  if (is_input()) {
    Fl_Input_* d = (Fl_Input_*)live_widget, *s = (Fl_Input_*)o;
    d->shortcut(s->shortcut());
  }

  // copy all attributes specific to widgets derived from Fl_Value_Input
  if (is_value_input()) {
    Fl_Value_Input* d = (Fl_Value_Input*)live_widget, *s = (Fl_Value_Input*)o;
    d->shortcut(s->shortcut());
  }

  // copy all attributes specific to widgets derived from Fl_Text_Display
  if (is_text_display()) {
    Fl_Text_Display* d = (Fl_Text_Display*)live_widget, *s = (Fl_Text_Display*)o;
    d->shortcut(s->shortcut());
  }

  // copy all attributes specific to Fl_Valuator and derived classes
  if (is_valuator()) {
    Fl_Valuator* d = (Fl_Valuator*)live_widget, *s = (Fl_Valuator*)o;
    d->minimum(s->minimum());
    d->maximum(s->maximum());
    d->step(s->step());
    d->value(s->value());
    if (is_valuator()>=2) {
      Fl_Slider *d = (Fl_Slider*)live_widget, *s = (Fl_Slider*)o;
      d->slider_size(s->slider_size());
    }
  }

  // copy all attributes specific to Fl_Spinner and derived classes
  if (is_spinner()) {
    Fl_Spinner* d = (Fl_Spinner*)live_widget, *s = (Fl_Spinner*)o;
    d->minimum(s->minimum());
    d->maximum(s->maximum());
    d->step(s->step());
    d->value(s->value());
  }
 
/* TODO: implement this
  {Fl_Font ff; int fs; Fl_Color fc; if (textstuff(4,ff,fs,fc)) {
    Fl_Font f; int s; Fl_Color c; textstuff(0,f,s,c);
    if (f != ff) write_string("textfont %d", f);
    if (s != fs) write_string("textsize %d", s);
    if (c != fc) write_string("textcolor %d", c);
  }}*/

  if (!o->visible()) 
    w->hide();
  if (!o->active()) 
    w->deactivate();
  if (resizable() && w->parent()) 
    w->parent()->resizable(o);
}